

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O2

int BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transfom_idx)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint8_t *puVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint8_t *puVar10;
  bool bVar11;
  
  puVar5 = transforms->prefix_suffix;
  puVar10 = transforms->transforms;
  lVar9 = (long)transfom_idx * 3;
  bVar2 = puVar10[lVar9 + 1];
  uVar4 = transforms->prefix_suffix_map[puVar10[lVar9 + 2]];
  pbVar1 = puVar5 + transforms->prefix_suffix_map[puVar10[lVar9]];
  bVar3 = *pbVar1;
  for (lVar9 = 0; (uint)bVar3 != (uint)lVar9; lVar9 = lVar9 + 1) {
    dst[lVar9] = pbVar1[lVar9 + 1];
  }
  uVar6 = (uint)bVar2;
  if (bVar2 < 10) {
    len = len - uVar6;
  }
  else if ((byte)(bVar2 - 0xc) < 9) {
    word = word + (bVar2 - 0xb);
    len = len - (bVar2 - 0xb);
  }
  uVar7 = 0;
  if (0 < len) {
    uVar7 = (ulong)(uint)len;
  }
  while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
    dst[lVar9] = *word;
    lVar9 = lVar9 + 1;
    word = word + 1;
  }
  if (uVar6 == 0xb) {
    puVar10 = dst + ((int)lVar9 - len);
    for (; 0 < len; len = len - uVar6) {
      uVar6 = ToUpperCase(puVar10);
      puVar10 = puVar10 + uVar6;
    }
  }
  else if (uVar6 == 10) {
    ToUpperCase(dst + ((int)lVar9 - len));
  }
  pbVar1 = puVar5 + uVar4;
  bVar2 = *pbVar1;
  for (lVar8 = 0; (uint)bVar2 != (uint)lVar8; lVar8 = lVar8 + 1) {
    dst[lVar9] = pbVar1[lVar8 + 1];
    lVar9 = lVar9 + 1;
  }
  return (int)lVar9;
}

Assistant:

int BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* BROTLI_RESTRICT transforms, int transfom_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transfom_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transfom_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transfom_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}